

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

_Bool init_graphics_modes(void)

{
  _Bool _Var1;
  ang_file *f_00;
  parser *p_00;
  char local_828 [8];
  char line [1024];
  parser_error local_41c;
  errr e;
  parser *p;
  ang_file *f;
  char buf [1024];
  
  local_41c = PARSE_ERROR_NONE;
  path_build((char *)&f,0x400,ANGBAND_DIR_TILES,"list.txt");
  f_00 = file_open((char *)&f,MODE_READ,FTYPE_TEXT);
  if (f_00 == (ang_file *)0x0) {
    msg("Cannot open \'%s\'.",&f);
    finish_parse_grafmode((parser *)0x0);
  }
  else {
    p_00 = init_parse_grafmode();
    do {
      _Var1 = file_getl(f_00,local_828,0x400);
      if (!_Var1) goto LAB_00177c9e;
      local_41c = parser_parse(p_00,local_828);
    } while (local_41c == PARSE_ERROR_NONE);
    print_error((char *)&f,p_00);
LAB_00177c9e:
    finish_parse_grafmode(p_00);
    file_close(f_00);
  }
  return local_41c == PARSE_ERROR_NONE;
}

Assistant:

bool init_graphics_modes(void) {
	char buf[1024];

	ang_file *f;
	struct parser *p;
	errr e = 0;

	/* Build the filename */
	path_build(buf, sizeof(buf), ANGBAND_DIR_TILES, "list.txt");

	f = file_open(buf, MODE_READ, FTYPE_TEXT);
	if (!f) {
		msg("Cannot open '%s'.", buf);
		finish_parse_grafmode(NULL);
	} else {
		char line[1024];

		p = init_parse_grafmode();
		while (file_getl(f, line, sizeof line)) {
			e = parser_parse(p, line);
			if (e != PARSE_ERROR_NONE) {
				print_error(buf, p);
				break;
			}
		}

		finish_parse_grafmode(p);
		file_close(f);
	}

	/* Result */
	return e == PARSE_ERROR_NONE;
}